

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3.hpp
# Opt level: O1

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::mrg3>::addin(mrg3 *r)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = (r->S).r[0];
  iVar1 = (r->S).r[1];
  uVar3 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar1 + (long)(r->P).a[0] * (long)iVar2;
  (r->S).r[2] = iVar1;
  (r->S).r[1] = iVar2;
  uVar4 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
  uVar3 = uVar4 - 0xfffffffe;
  if (uVar4 < 0xfffffffe) {
    uVar3 = uVar4;
  }
  iVar2 = (int)uVar3 + -0x7fffffff;
  if (uVar3 < 0x7fffffff) {
    iVar2 = (int)uVar3;
  }
  (r->S).r[0] = iVar2;
  return (double)iVar2;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg3::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2])};
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 3>(t);
  }